

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O0

Ssc_Man_t * Ssc_ManStart(Gia_Man_t *pAig,Gia_Man_t *pCare,Ssc_Pars_t *pPars)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Vec_Int_t *pVVar4;
  Ssc_Man_t *p;
  Ssc_Pars_t *pPars_local;
  Gia_Man_t *pCare_local;
  Gia_Man_t *pAig_local;
  
  pAig_local = (Gia_Man_t *)calloc(1,0xd0);
  pAig_local->pName = (char *)pPars;
  pAig_local->pSpec = (char *)pAig;
  *(Gia_Man_t **)&pAig_local->nRegs = pCare;
  pGVar3 = Gia_ManDupDfs(*(Gia_Man_t **)&pAig_local->nRegs);
  *(Gia_Man_t **)&pAig_local->nObjs = pGVar3;
  iVar1 = Vec_IntSize(&(*(Gia_Man_t **)&pAig_local->nObjs)->vHTable);
  if (iVar1 != 0) {
    __assert_fail("Vec_IntSize(&p->pFraig->vHTable) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscCore.c"
                  ,0x58,"Ssc_Man_t *Ssc_ManStart(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)");
  }
  iVar1 = Gia_ManHasDangling(*(Gia_Man_t **)&pAig_local->nObjs);
  if (iVar1 == 0) {
    Gia_ManInvertPos(*(Gia_Man_t **)&pAig_local->nObjs);
    Ssc_ManStartSolver((Ssc_Man_t *)pAig_local);
    if ((sat_solver *)pAig_local->pObjs == (sat_solver *)0x0) {
      printf("Constraints are UNSAT after propagation.\n");
      Ssc_ManStop((Ssc_Man_t *)pAig_local);
      pAig_local = (Gia_Man_t *)0x1;
    }
    else {
      pVVar4 = Ssc_ManFindPivotSat((Ssc_Man_t *)pAig_local);
      *(Vec_Int_t **)&pAig_local->nBufs = pVVar4;
      if (*(Vec_Int_t **)&pAig_local->nBufs == (Vec_Int_t *)0x1) {
        printf("Constraints are UNSAT.\n");
        Ssc_ManStop((Ssc_Man_t *)pAig_local);
        pAig_local = (Gia_Man_t *)0x1;
      }
      else if (*(Vec_Int_t **)&pAig_local->nBufs == (Vec_Int_t *)0x0) {
        printf("Conflict limit is reached while trying to find one SAT assignment.\n");
        Ssc_ManStop((Ssc_Man_t *)pAig_local);
        pAig_local = (Gia_Man_t *)0x0;
      }
      else {
        sat_solver_bookmark((sat_solver *)pAig_local->pObjs);
        Gia_ManSetPhasePattern((Gia_Man_t *)pAig_local->pSpec,*(Vec_Int_t **)&pAig_local->nBufs);
        Gia_ManSetPhasePattern(*(Gia_Man_t **)&pAig_local->nRegs,*(Vec_Int_t **)&pAig_local->nBufs);
        iVar1 = Gia_ManCheckCoPhase(*(Gia_Man_t **)&pAig_local->nRegs);
        if (iVar1 == 0) {
          pVVar4 = Vec_IntAlloc(100);
          *(Vec_Int_t **)&pAig_local->vHTable = pVVar4;
          pVVar4 = Vec_IntAlloc(100);
          (pAig_local->vHash).pArray = &pVVar4->nCap;
          pVVar4 = Vec_IntAlloc(100);
          *(Vec_Int_t **)&pAig_local->vHash = pVVar4;
          pVVar4 = Vec_IntAlloc(100);
          pAig_local->vCos = pVVar4;
          Ssc_GiaClassesInit(pAig);
        }
        else {
          uVar2 = Gia_ManCheckCoPhase(*(Gia_Man_t **)&pAig_local->nRegs);
          printf("Computed reference pattern violates %d constraints (this is a bug!).\n",
                 (ulong)uVar2);
          Ssc_ManStop((Ssc_Man_t *)pAig_local);
          pAig_local = (Gia_Man_t *)0x0;
        }
      }
    }
    return (Ssc_Man_t *)pAig_local;
  }
  __assert_fail("!Gia_ManHasDangling(p->pFraig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscCore.c"
                ,0x59,"Ssc_Man_t *Ssc_ManStart(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)");
}

Assistant:

Ssc_Man_t * Ssc_ManStart( Gia_Man_t * pAig, Gia_Man_t * pCare, Ssc_Pars_t * pPars )
{
    Ssc_Man_t * p;
    p = ABC_CALLOC( Ssc_Man_t, 1 );
    p->pPars  = pPars;
    p->pAig   = pAig;
    p->pCare  = pCare;
    p->pFraig = Gia_ManDupDfs( p->pCare );
    assert( Vec_IntSize(&p->pFraig->vHTable) == 0 );
    assert( !Gia_ManHasDangling(p->pFraig) );
    Gia_ManInvertPos( p->pFraig );
    Ssc_ManStartSolver( p );
    if ( p->pSat == NULL )
    {
        printf( "Constraints are UNSAT after propagation.\n" );
        Ssc_ManStop( p );
        return (Ssc_Man_t *)(ABC_PTRINT_T)1;
    }
//    p->vPivot = Ssc_GiaFindPivotSim( p->pFraig );
//    Vec_IntFreeP( &p->vPivot  );
    p->vPivot = Ssc_ManFindPivotSat( p );
    if ( p->vPivot == (Vec_Int_t *)(ABC_PTRINT_T)1 )
    {
        printf( "Constraints are UNSAT.\n" );
        Ssc_ManStop( p );
        return (Ssc_Man_t *)(ABC_PTRINT_T)1;
    }
    if ( p->vPivot == NULL )
    {
        printf( "Conflict limit is reached while trying to find one SAT assignment.\n" );
        Ssc_ManStop( p );
        return NULL;
    }
    sat_solver_bookmark( p->pSat );
//    Vec_IntPrint( p->vPivot );
    Gia_ManSetPhasePattern( p->pAig, p->vPivot );
    Gia_ManSetPhasePattern( p->pCare, p->vPivot );
    if ( Gia_ManCheckCoPhase(p->pCare) )
    {
        printf( "Computed reference pattern violates %d constraints (this is a bug!).\n", Gia_ManCheckCoPhase(p->pCare) );
        Ssc_ManStop( p );
        return NULL;
    }
    // other things
    p->vDisPairs = Vec_IntAlloc( 100 );
    p->vPattern = Vec_IntAlloc( 100 );
    p->vFanins = Vec_IntAlloc( 100 );
    p->vFront = Vec_IntAlloc( 100 );
    Ssc_GiaClassesInit( pAig );
    // now it is ready for refinement using simulation 
    return p;
}